

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::StoreValue
          (FlagImpl *this,void *src,ValueSource source)

{
  uint uVar1;
  atomic<long> *paVar2;
  void *pvVar3;
  atomic<unsigned_long> *dst;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar4;
  ptr_t pvVar5;
  int64_t one_word_val;
  MutexLock local_30;
  
  uVar1 = *(uint *)&this->field_0x28 >> 1 & 3;
  if (uVar1 < 2) {
    paVar2 = OneWordValue(this);
    one_word_val = (paVar2->super___atomic_base<long>)._M_i;
    pvVar3 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
    memcpy(&one_word_val,src,(size_t)pvVar3);
    paVar2 = OneWordValue(this);
    (paVar2->super___atomic_base<long>)._M_i = one_word_val;
  }
  else {
    if (uVar1 == 2) {
      dst = AtomicBufferValue(this);
      pvVar3 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      SequenceLock::Write(&this->seq_lock_,dst,src,(size_t)pvVar3);
      goto LAB_00105c50;
    }
    paVar4 = PtrStorage(this);
    pvVar5 = (paVar4->_M_i).ptr_;
    if ((~(uint)pvVar5 & 3) == 0) {
      one_word_val = (ulong)pvVar5 & 0xfffffffffffffffc;
      local_30.mu_ = (Mutex *)&(anonymous_namespace)::s_freelist_guard;
      absl::lts_20240722::Mutex::Lock();
      if ((anonymous_namespace)::s_freelist == (vector<void_*,_std::allocator<void_*>_> *)0x0) {
        (anonymous_namespace)::s_freelist =
             (vector<void_*,_std::allocator<void_*>_> *)operator_new(0x18);
        ((anonymous_namespace)::s_freelist->super__Vector_base<void_*,_std::allocator<void_*>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((anonymous_namespace)::s_freelist->super__Vector_base<void_*,_std::allocator<void_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((anonymous_namespace)::s_freelist->super__Vector_base<void_*,_std::allocator<void_*>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((anonymous_namespace)::s_freelist,(value_type *)&one_word_val);
      MutexLock::~MutexLock(&local_30);
      pvVar3 = Clone(this->op_,src);
      MaskedPointer::MaskedPointer((MaskedPointer *)&one_word_val,pvVar3,source == kCommandLine);
      pvVar5 = (ptr_t)one_word_val;
    }
    else {
      (*this->op_)(kCopy,src,(void *)((ulong)pvVar5 & 0xfffffffffffffffc),(void *)0x0);
      pvVar5 = (ptr_t)((ulong)(source == kCommandLine) | (ulong)pvVar5);
    }
    paVar4 = PtrStorage(this);
    (paVar4->_M_i).ptr_ = pvVar5;
  }
  SequenceLock::IncrementModificationCount(&this->seq_lock_);
LAB_00105c50:
  this->field_0x29 = this->field_0x29 | 4;
  InvokeCallback(this);
  return;
}

Assistant:

void FlagImpl::StoreValue(const void* src, ValueSource source) {
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      // Load the current value to avoid setting 'init' bit manually.
      int64_t one_word_val = OneWordValue().load(std::memory_order_acquire);
      std::memcpy(&one_word_val, src, Sizeof(op_));
      OneWordValue().store(one_word_val, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      seq_lock_.Write(AtomicBufferValue(), src, Sizeof(op_));
      break;
    }
    case FlagValueStorageKind::kHeapAllocated:
      MaskedPointer ptr_value = PtrStorage().load(std::memory_order_acquire);

      if (ptr_value.IsUnprotectedReadCandidate() && ptr_value.HasBeenRead()) {
        // If current value is a candidate for an unprotected read and if it was
        // already read at least once, follow up reads (if any) are done without
        // mutex protection. We can't guarantee it is safe to reuse this memory
        // since it may have been accessed by another thread concurrently, so
        // instead we move the memory to a freelist so it can still be safely
        // accessed, and allocate a new one for the new value.
        AddToFreelist(ptr_value.Ptr());
        ptr_value = MaskedPointer(Clone(op_, src), source == kCommandLine);
      } else {
        // Current value either was set programmatically or was never read.
        // We can reuse the memory since all accesses to this value (if any)
        // were protected by mutex. That said, if a new value comes from command
        // line it now becomes a candidate for an unprotected read.
        ptr_value.Set(op_, src, source == kCommandLine);
      }

      PtrStorage().store(ptr_value, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
  }
  modified_ = true;
  InvokeCallback();
}